

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

ssize_t __thiscall Arcflow::write(Arcflow *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  pointer pAVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  runtime_error *this_00;
  long lVar7;
  undefined4 in_register_00000034;
  FILE *__s;
  int i;
  int iVar8;
  Arc *a;
  pointer pAVar9;
  char _error_msg_ [256];
  char acStack_138 [264];
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (this->ready != false) {
    pAVar9 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_start;
    pAVar3 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    if (pAVar9 != pAVar3) {
      uVar5 = ((long)pAVar3 - (long)pAVar9 >> 2) * -0x5555555555555555;
      lVar7 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar9,pAVar3,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar9,pAVar3);
    }
    fwrite("#GRAPH_BEGIN#\n",0xe,1,__s);
    fprintf(__s,"$NBTYPES{%d};\n",(ulong)(uint)(this->inst).nbtypes);
    fprintf(__s,"$S{%d};\n",0);
    fwrite("$Ts{",4,1,__s);
    if (0 < (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
      lVar7 = 0;
      do {
        if (lVar7 != 0) {
          fputc(0x2c,__s);
        }
        fprintf(__s,"%d",(ulong)(uint)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2));
    }
    fwrite("};\n",3,1,__s);
    fprintf(__s,"$LOSS{%d};\n",(ulong)(uint)this->LOSS);
    iVar4 = NodeSet::size(&this->NS);
    fprintf(__s,"$NV{%d};\n",(ulong)(uint)this->NV);
    fprintf(__s,"$NA{%d};\n",(ulong)(uint)this->NA);
    pAVar9 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_start;
    pAVar3 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    if (pAVar9 != pAVar3) {
      uVar5 = ((long)pAVar3 - (long)pAVar9 >> 2) * -0x5555555555555555;
      lVar7 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar9,pAVar3,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar9,pAVar3);
    }
    fwrite("$ARCS{\n",7,1,__s);
    iVar8 = 0;
    do {
      pAVar3 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pAVar9 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                    super__Vector_impl_data._M_start; pAVar9 != pAVar3; pAVar9 = pAVar9 + 1) {
        uVar1 = pAVar9->u;
        if (uVar1 == 0 || iVar8 != 1) {
          uVar2 = pAVar9->v;
          if ((iVar8 != 2) || (iVar4 <= (int)uVar2)) {
            if ((iVar8 != 0) || (uVar1 != 0 && (int)uVar2 < iVar4)) {
              fprintf(__s,"%d %d %d\n",(ulong)uVar1,(ulong)uVar2,(ulong)(uint)pAVar9->label);
            }
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    fwrite("};\n",3,1,__s);
    sVar6 = fwrite("#GRAPH_END#\n",0xc,1,__s);
    return sVar6;
  }
  snprintf(acStack_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "ready == true",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x211);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,acStack_138);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::write(FILE *fout) {
	throw_assert(ready == true);
	sort(all(A));

	int iS = 0;
	fprintf(fout, "#GRAPH_BEGIN#\n");
	fprintf(fout, "$NBTYPES{%d};\n", inst.nbtypes);
	fprintf(fout, "$S{%d};\n", iS);
	fprintf(fout, "$Ts{");
	for (int t = 0; t < static_cast<int>(Ts.size()); t++) {
		if (t) fprintf(fout, ",");
		fprintf(fout, "%d", Ts[t]);
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$LOSS{%d};\n", LOSS);

	int lastv = NS.size() - 1;
	fprintf(fout, "$NV{%d};\n", NV);
	fprintf(fout, "$NA{%d};\n", NA);

	sort(all(A));
	fprintf(fout, "$ARCS{\n");
	for (int i = 0; i < 3; i++) {
		for (const Arc &a : A) {
			if (i == 1 && a.u != iS) {
				continue;
			} else if (i == 2 && a.v <= lastv) {
				continue;
			} else if (i == 0 && (a.u == iS || a.v > lastv)) {
				continue;
			}
			if (a.label == LOSS) {
				fprintf(fout, "%d %d %d\n", a.u, a.v, LOSS);
			} else {
				fprintf(fout, "%d %d %d\n", a.u, a.v, a.label);
			}
		}
	}
	fprintf(fout, "};\n");
	fprintf(fout, "#GRAPH_END#\n");
}